

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O0

FixedFieldInfo * __thiscall
ObjTypeSpecFldInfo::GetFixedFieldIfAvailableAsFixedFunction(ObjTypeSpecFldInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FixedFieldInfo *pFVar4;
  intptr_t iVar5;
  ObjTypeSpecFldInfo *this_local;
  
  bVar2 = HasFixedValue(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x13f,"(HasFixedValue())","HasFixedValue()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsMono(this);
  if ((bVar2) || ((bVar2 = IsPoly(this), bVar2 && (bVar2 = DoesntHaveEquivalence(this), !bVar2)))) {
    if ((this->m_data).fixedFieldInfoArraySize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x144,"(m_data.fixedFieldInfoArraySize > 0)",
                         "m_data.fixedFieldInfoArraySize > 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pFVar4 = GetFixedFieldInfoArray(this);
    if (pFVar4 == (FixedFieldInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x145,"(GetFixedFieldInfoArray())","GetFixedFieldInfoArray()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pFVar4 = GetFixedFieldInfoArray(this);
    iVar5 = FixedFieldInfo::GetFuncInfoAddr(pFVar4);
    if (iVar5 == 0) {
      this_local = (ObjTypeSpecFldInfo *)0x0;
    }
    else {
      this_local = (ObjTypeSpecFldInfo *)GetFixedFieldInfoArray(this);
    }
  }
  else {
    this_local = (ObjTypeSpecFldInfo *)0x0;
  }
  return (FixedFieldInfo *)this_local;
}

Assistant:

FixedFieldInfo *
ObjTypeSpecFldInfo::GetFixedFieldIfAvailableAsFixedFunction()
{
    Assert(HasFixedValue());
    if (!IsMono() && !(IsPoly() && !DoesntHaveEquivalence()))
    {
        return nullptr;
    }
    AssertOrFailFast(m_data.fixedFieldInfoArraySize > 0);
    Assert(GetFixedFieldInfoArray());
    if (GetFixedFieldInfoArray()[0].GetFuncInfoAddr() != 0)
    {
        return &GetFixedFieldInfoArray()[0];
    }
    return nullptr;
}